

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
kj::ArrayBuilder<kj::Promise<void>_>::truncate
          (ArrayBuilder<kj::Promise<void>_> *this,char *__file,__off_t __length)

{
  Promise<void> *pPVar1;
  Promise<void> *pPVar2;
  PromiseNode *pPVar3;
  Disposer *pDVar4;
  
  pPVar1 = this->ptr;
  pPVar2 = this->pos;
  while (pPVar1 + (long)__file < pPVar2) {
    this->pos = pPVar2 + -1;
    pPVar3 = pPVar2[-1].super_PromiseBase.node.ptr;
    if (pPVar3 != (PromiseNode *)0x0) {
      pPVar2[-1].super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      pDVar4 = pPVar2[-1].super_PromiseBase.node.disposer;
      (**pDVar4->_vptr_Disposer)
                (pDVar4,pPVar3->_vptr_PromiseNode[-2] + (long)&pPVar3->_vptr_PromiseNode);
    }
    pPVar2 = this->pos;
  }
  return (int)pPVar2;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }